

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.cpp
# Opt level: O3

bool __thiscall nivalis::Shell::eval_line(Shell *this,string *line)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  undefined8 uVar5;
  size_t sVar6;
  long lVar7;
  util *puVar8;
  ostream *poVar9;
  pointer pAVar10;
  double dVar11;
  uint64_t uVar12;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *pcVar13;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  ulong uVar14;
  util *puVar15;
  bool bVar16;
  string_view expr_00;
  string_view expr_01;
  string_view expr_02;
  string_view expr_03;
  string parse_err;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  def_fn_args;
  vector<unsigned_long,_std::allocator<unsigned_long>_> bindings;
  string var;
  string str_to_parse;
  string cmd;
  Expr expr;
  string local_168;
  double local_148;
  uint32_t local_13c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  string local_118;
  string local_f0;
  int local_cc;
  string local_c8;
  string local_a8;
  Expr local_88;
  Expr local_70;
  uint64_t local_58;
  long local_50;
  Expr local_48;
  
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  local_f0._M_string_length = 0;
  local_f0.field_2._M_local_buf[0] = '\0';
  local_138.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  util::trim(line);
  std::__cxx11::string::_M_assign((string *)&local_c8);
  iVar4 = std::__cxx11::string::compare((char *)line);
  if (iVar4 == 0) {
    this->closed = true;
    bVar16 = true;
    goto LAB_0010d14d;
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  if ((line->_M_string_length != 0) && (*(line->_M_dataplus)._M_p == '%')) {
    anon_unknown.dwarf_4856e::get_word(&local_168,line);
    std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_168);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,
                      CONCAT71(local_168.field_2._M_allocated_capacity._1_7_,
                               local_168.field_2._M_local_buf[0]) + 1);
    }
  }
  util::trim(line);
  util::trim(&local_a8);
  iVar4 = std::__cxx11::string::compare((char *)&local_a8);
  if (iVar4 == 0) {
    bVar16 = Environment::del(this->env,line);
    poVar9 = this->os;
    if (bVar16) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"del ",4);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,(line->_M_dataplus)._M_p,line->_M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
      goto LAB_0010cb76;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"Undefined variable ",0x13);
LAB_0010cbba:
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,(line->_M_dataplus)._M_p,line->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
LAB_0010d126:
    bVar16 = false;
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)&local_a8);
    if (iVar4 == 0) {
      bVar16 = Environment::del_func(this->env,line);
      poVar9 = this->os;
      if (!bVar16) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"Undefined function ",0x13);
        goto LAB_0010cbba;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"delf ",5);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,(line->_M_dataplus)._M_p,line->_M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
LAB_0010cb76:
      std::ostream::put((char)poVar9);
      bVar16 = true;
      std::ostream::flush();
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)&local_a8);
      bVar16 = true;
      if ((iVar4 != 0) && (iVar4 = std::__cxx11::string::compare((char *)&local_a8), iVar4 != 0)) {
        iVar4 = std::__cxx11::string::compare((char *)&local_a8);
        bVar16 = iVar4 == 0;
      }
      if (this->use_latex == false) {
        iVar4 = std::__cxx11::string::compare((char *)&local_a8);
        if (iVar4 == 0) goto LAB_0010ca70;
        local_148 = (double)((ulong)local_148 & 0xffffffff00000000);
      }
      else {
LAB_0010ca70:
        uVar5 = std::__cxx11::string::compare((char *)&local_a8);
        local_148 = (double)CONCAT44(local_148._4_4_,
                                     (int)CONCAT71((int7)((ulong)uVar5 >> 8),(int)uVar5 != 0));
      }
      iVar4 = std::__cxx11::string::compare((char *)&local_a8);
      if (bVar16 != false) {
        std::__cxx11::string::_M_assign((string *)&local_c8);
      }
      if (iVar4 == 0) {
        anon_unknown.dwarf_4856e::get_word(&local_168,line);
        util::trim(&local_168);
        util::trim(line);
        expr_00._M_str = extraout_RDX;
        expr_00._M_len = (size_t)local_168._M_dataplus._M_p;
        bVar2 = util::is_varname((util *)local_168._M_string_length,expr_00);
        if (bVar2) {
          local_58 = Environment::addr_of(this->env,&local_168,false);
          std::__cxx11::string::_M_assign((string *)&local_c8);
        }
        else {
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (this->os,local_168._M_dataplus._M_p,local_168._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9," is not a valid variable name\n",0x1e);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p,
                          CONCAT71(local_168.field_2._M_allocated_capacity._1_7_,
                                   local_168.field_2._M_local_buf[0]) + 1);
        }
        if (!bVar2) goto LAB_0010d126;
      }
      bVar3 = *local_c8._M_dataplus._M_p;
      local_cc = iVar4;
      if (((((byte)((bVar3 & 0xdf) + 0xbf) < 0x1a) || (bVar3 == 0x5f)) || (bVar3 == 0x27)) &&
         (expr_03._M_str = local_c8._M_dataplus._M_p, expr_03._M_len = local_c8._M_string_length,
         sVar6 = util::find_equality(expr_03,false,true), sVar6 != 0xffffffffffffffff)) {
        std::__cxx11::string::substr((ulong)&local_168,(ulong)&local_c8);
        std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_168);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p,
                          CONCAT71(local_168.field_2._M_allocated_capacity._1_7_,
                                   local_168.field_2._M_local_buf[0]) + 1);
        }
        util::trim(&local_f0);
        bVar3 = (local_f0._M_dataplus._M_p + -1)[local_f0._M_string_length];
        local_13c = 0x18;
        pcVar13 = extraout_RDX_00;
        if ((bVar3 - 0x25 < 0x3a) &&
           (pcVar13 = (char *)0x200000000000561,
           (0x200000000000561U >> ((ulong)(bVar3 - 0x25) & 0x3f) & 1) != 0)) {
          local_13c = OpCode::from_char(bVar3);
          std::__cxx11::string::pop_back();
          util::trim(&local_f0);
          bVar3 = (local_f0._M_dataplus._M_p + -1)[local_f0._M_string_length];
          pcVar13 = extraout_RDX_01;
        }
        if (bVar3 != 0x29) {
          expr_02._M_str = pcVar13;
          expr_02._M_len = (size_t)local_f0._M_dataplus._M_p;
          bVar2 = util::is_varname((util *)local_f0._M_string_length,expr_02);
          if (bVar2) {
            std::__cxx11::string::substr((ulong)&local_168,(ulong)&local_c8);
            std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_168);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_168._M_dataplus._M_p != &local_168.field_2) {
              operator_delete(local_168._M_dataplus._M_p,
                              CONCAT71(local_168.field_2._M_allocated_capacity._1_7_,
                                       local_168.field_2._M_local_buf[0]) + 1);
            }
          }
          goto LAB_0010cfd3;
        }
        bVar2 = false;
        lVar7 = std::__cxx11::string::find((char)&local_f0,0x28);
        if (lVar7 != -1) {
          puVar15 = (util *)(lVar7 + 1);
          local_50 = lVar7;
          if (puVar15 < local_f0._M_string_length) {
            puVar8 = (util *)local_f0._M_string_length;
            do {
              if ((local_f0._M_dataplus._M_p[(long)puVar15] == ')') ||
                 (local_f0._M_dataplus._M_p[(long)puVar15] == ',')) {
                std::__cxx11::string::substr((ulong)&local_168,(ulong)&local_f0);
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &local_138,&local_168);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_168._M_dataplus._M_p != &local_168.field_2) {
                  operator_delete(local_168._M_dataplus._M_p,
                                  CONCAT71(local_168.field_2._M_allocated_capacity._1_7_,
                                           local_168.field_2._M_local_buf[0]) + 1);
                }
                util::trim(local_138.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish + -1);
                if (((local_f0._M_dataplus._M_p[(long)puVar15] == ')') &&
                    ((long)local_138.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_138.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start == 0x20)) &&
                   (local_138.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1]._M_string_length == 0)) {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::_M_erase_at_end(&local_138,
                                    local_138.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
                  break;
                }
                if (((util *)local_138.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_string_length ==
                     (util *)0x0) ||
                   ((pcVar13 = local_138.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_dataplus._M_p,
                    puVar8 = (util *)local_f0._M_string_length, *pcVar13 != '$' &&
                    (expr_01._M_str = extraout_RDX_02, expr_01._M_len = (size_t)pcVar13,
                    bVar2 = util::is_varname((util *)local_138.
                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish[-1].
                                                  _M_string_length,expr_01),
                    puVar8 = (util *)local_f0._M_string_length, !bVar2)))) {
                  poVar9 = this->os;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\'",1);
                  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                     (poVar9,local_138.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish[-1].
                                             _M_dataplus._M_p,
                                      local_138.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish[-1].
                                      _M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar9,"\': invalid argument variable name\n",0x22);
                  bVar2 = false;
                  goto LAB_0010cf23;
                }
              }
              puVar15 = puVar15 + 1;
            } while (puVar15 < puVar8);
          }
          bVar2 = true;
LAB_0010cf23:
          std::__cxx11::string::substr((ulong)&local_168,(ulong)&local_f0);
          std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_168);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_dataplus._M_p != &local_168.field_2) {
            operator_delete(local_168._M_dataplus._M_p,
                            CONCAT71(local_168.field_2._M_allocated_capacity._1_7_,
                                     local_168.field_2._M_local_buf[0]) + 1);
          }
          util::rtrim(&local_f0);
          if (!bVar2) goto LAB_0010cfd3;
          std::__cxx11::string::substr((ulong)&local_168,(ulong)&local_c8);
          std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_168);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_dataplus._M_p != &local_168.field_2) {
            operator_delete(local_168._M_dataplus._M_p,
                            CONCAT71(local_168.field_2._M_allocated_capacity._1_7_,
                                     local_168.field_2._M_local_buf[0]) + 1);
          }
          bVar2 = true;
        }
      }
      else {
        local_13c = 0x18;
LAB_0010cfd3:
        bVar2 = false;
      }
      if (local_138.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_138.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        lVar7 = 0;
        uVar14 = 0;
        do {
          Environment::addr_of
                    (this->env,
                     (string *)
                     ((long)&((local_138.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar7
                     ),false);
          uVar14 = uVar14 + 1;
          lVar7 = lVar7 + 0x20;
        } while (uVar14 < (ulong)((long)local_138.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_138.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      paVar1 = &local_168.field_2;
      local_168._M_string_length = 0;
      local_168.field_2._M_local_buf[0] = '\0';
      local_168._M_dataplus._M_p = (pointer)paVar1;
      if (local_148._0_1_ == '\0') {
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_118,local_c8._M_dataplus._M_p,
                   local_c8._M_dataplus._M_p + local_c8._M_string_length);
      }
      else {
        nivalis::latex_to_nivalis(&local_118,&local_c8);
      }
      iVar4 = local_cc;
      parse(&local_88,&local_118,this->env,(bool)(~bVar16 & local_cc != 0),true,
            (long)local_138.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_138.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5,&local_168);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      if ((util *)local_168._M_string_length != (util *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (this->os,local_168._M_dataplus._M_p,local_168._M_string_length);
LAB_0010d0f2:
        if (local_88.ast.
            super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_88.ast.
                          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_88.ast.
                                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_88.ast.
                                super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != paVar1) {
          operator_delete(local_168._M_dataplus._M_p,
                          CONCAT71(local_168.field_2._M_allocated_capacity._1_7_,
                                   local_168.field_2._M_local_buf[0]) + 1);
        }
        goto LAB_0010d126;
      }
      if (bVar16 == false) {
        if (iVar4 == 0) {
          Expr::diff((Expr *)&local_118,&local_88,local_58,this->env);
          poVar9 = Expr::repr((Expr *)&local_118,this->os,this->env);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_118._M_dataplus._M_p,
                            local_118.field_2._M_allocated_capacity -
                            (long)local_118._M_dataplus._M_p);
          }
        }
        else if (bVar2) {
          local_118._M_dataplus._M_p = (pointer)0x0;
          local_118._M_string_length = 0;
          local_118.field_2._M_allocated_capacity = 0;
          if (local_138.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_138.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            lVar7 = 0;
            uVar14 = 0;
            do {
              pAVar10 = (pointer)0xffffffffffffffff;
              if (**(char **)((long)&((local_138.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                             + lVar7) != '$') {
                pAVar10 = (pointer)Environment::addr_of
                                             (this->env,
                                              (string *)
                                              ((long)&((local_138.
                                                                                                                
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar7),true);
              }
              local_70.ast.
              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
              _M_impl.super__Vector_impl_data._M_start = pAVar10;
              if (local_118._M_string_length == local_118.field_2._M_allocated_capacity) {
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                _M_realloc_insert<unsigned_long>
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_118,
                           (iterator)local_118._M_string_length,(unsigned_long *)&local_70);
              }
              else {
                *(pointer *)local_118._M_string_length = pAVar10;
                local_118._M_string_length = local_118._M_string_length + 8;
              }
              uVar14 = uVar14 + 1;
              lVar7 = lVar7 + 0x20;
            } while (uVar14 < (ulong)((long)local_138.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_138.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 5));
          }
          dVar11 = (double)Environment::def_func
                                     (this->env,&local_f0,&local_88,
                                      (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                      &local_118);
          if (dVar11 != -NAN) {
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               (this->os,local_f0._M_dataplus._M_p,local_f0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"(",1);
            local_148 = dVar11;
            if (local_138.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                local_138.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              uVar14 = 0;
              do {
                if (uVar14 != 0) {
                  std::__ostream_insert<char,std::char_traits<char>>(this->os,", ",2);
                }
                poVar9 = this->os;
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,"$",1);
                std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
                uVar14 = uVar14 + 1;
              } while (uVar14 < (ulong)((long)local_138.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)local_138.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start >> 5));
            }
            std::__ostream_insert<char,std::char_traits<char>>(this->os,") = ",4);
            poVar9 = Expr::repr(&(this->env->funcs).
                                 super__Vector_base<nivalis::Environment::UserFunction,_std::allocator<nivalis::Environment::UserFunction>_>
                                 ._M_impl.super__Vector_impl_data._M_start[(long)local_148].expr,
                                this->os,this->env);
            std::endl<char,std::char_traits<char>>(poVar9);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_118._M_dataplus._M_p,
                            local_118.field_2._M_allocated_capacity -
                            (long)local_118._M_dataplus._M_p);
          }
        }
        else {
          local_148 = Expr::operator()(&local_88,this->env);
          if (!NAN(local_148)) {
            if (((util *)local_f0._M_string_length == (util *)0x0) ||
               ((util *)local_168._M_string_length != (util *)0x0)) {
              poVar9 = std::ostream::_M_insert<double>(local_148);
              std::endl<char,std::char_traits<char>>(poVar9);
            }
            else {
              if (local_13c != 0x18) {
                uVar12 = Environment::addr_of(this->env,&local_f0,true);
                if (uVar12 == 0xffffffffffffffff) {
                  poVar9 = this->os;
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar9,"Undefined variable \"",0x14);
                  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                     (poVar9,local_f0._M_dataplus._M_p,local_f0._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar9,"\" (operator assignment)\n",0x18);
                  goto LAB_0010d0f2;
                }
                Expr::constant(&local_70,
                               (this->env->vars).super__Vector_base<double,_std::allocator<double>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar12]);
                Expr::constant(&local_48,local_148);
                Expr::combine((Expr *)&local_118,&local_70,local_13c,&local_48);
                local_148 = Expr::operator()((Expr *)&local_118,this->env);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_118._M_dataplus._M_p !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0) {
                  operator_delete(local_118._M_dataplus._M_p,
                                  local_118.field_2._M_allocated_capacity -
                                  (long)local_118._M_dataplus._M_p);
                }
                if (local_48.ast.
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_48.ast.
                                  super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)local_48.ast.
                                        super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_48.ast.
                                        super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                if (local_70.ast.
                    super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_70.ast.
                                  super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  (long)local_70.ast.
                                        super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_70.ast.
                                        super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
              }
              Environment::set(this->env,&local_f0,local_148);
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                 (this->os,local_f0._M_dataplus._M_p,local_f0._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9," = ",3);
              poVar9 = std::ostream::_M_insert<double>(local_148);
              std::endl<char,std::char_traits<char>>(poVar9);
            }
          }
        }
      }
      else {
        Expr::optimize(&local_88,5);
        poVar9 = Expr::repr(&local_88,this->os,this->env);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
      }
      if (local_88.ast.
          super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88.ast.
                        super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_88.ast.
                              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.ast.
                              super__Vector_base<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p,
                        CONCAT71(local_168.field_2._M_allocated_capacity._1_7_,
                                 local_168.field_2._M_local_buf[0]) + 1);
      }
      bVar16 = true;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,
                    CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                             local_a8.field_2._M_local_buf[0]) + 1);
  }
LAB_0010d14d:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,
                    CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                             local_f0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                             local_c8.field_2._M_local_buf[0]) + 1);
  }
  return bVar16;
}

Assistant:

bool Shell::eval_line(std::string line) {
    int assn_opcode = OpCode::bsel;
    std::string str_to_parse, var;
    std::vector<std::string> def_fn_args;
    bool def_fn;
    util::trim(line);
    str_to_parse = line;
    if (line == "exit") {
        // Exit shell, if applicable
        closed = true;
        return true;
    }

    std::string cmd;
    if (line.size() && line[0] == '%') {
        cmd = get_word(line);
    }
    util::trim(line);
    util::trim(cmd);
    if (cmd == "%del") {
        // Delete variable
        if (env.del(line)) {
            os << "del " << line << std::endl;
        } else {
            os << "Undefined variable " << line << "\n";
            return false;
        }
    } else if (cmd == "%delf") {
        // Delete function
        if (env.del_func(line)) {
            os << "delf " << line << std::endl;
        } else {
            os << "Undefined function " << line << "\n";
            return false;
        }
    } else {
        bool do_optim = cmd == "%" || cmd == "%tex" || cmd == "%niv";
        bool will_use_latex = (use_latex || cmd == "%tex") && cmd != "%niv";
        bool do_diff = cmd == "%diff";
        if (do_optim) str_to_parse = line;
        uint64_t diff_var_addr;
        if (do_diff) {
            std::string diff_var = get_word(line);
            util::trim(diff_var); util::trim(line);
            if (!util::is_varname(diff_var)) {
                os << diff_var << " is not a valid variable name\n";
                return false;
            }
            diff_var_addr = env.addr_of(diff_var, false);
            str_to_parse = line;
        }
        // Evaluate
        def_fn = false;
        assn_opcode = OpCode::bsel;
        if (util::is_varname_first(str_to_parse[0])) {
            size_t pos = util::find_equality(str_to_parse);
            if (~pos) {
                var = str_to_parse.substr(0, pos);
                util::trim(var);
                if (util::is_arith_operator(var.back())) {
                    assn_opcode = OpCode::from_char(var.back());
                    var.pop_back();
                    util::trim(var);
                }
                if (var.back() == ')') {
                    auto brpos = var.find('(');
                    if (brpos != std::string::npos) {
                        // Function def
                        def_fn = true;
                        size_t prev_comma = brpos + 1;
                        for (size_t i = brpos + 1; i < var.size(); ++i) {
                            if (var[i] == ',' || var[i] == ')') {
                                def_fn_args.push_back(var.substr(
                                            prev_comma, i - prev_comma));
                                util::trim(def_fn_args.back());
                                if (var[i] == ')' && def_fn_args.size() == 1 &&
                                    def_fn_args.back().empty()) {
                                    // Function with no arguments
                                    def_fn_args.clear();
                                    break;
                                }
                                if (def_fn_args.back().empty() ||
                                    (def_fn_args.back()[0] != '$' &&
                                    !util::is_varname(def_fn_args.back()))) {
                                    os << "'" << def_fn_args.back() <<
                                        "': invalid argument variable name\n";
                                    def_fn = false;
                                    break;
                                }
                                prev_comma = i + 1;
                            }
                        }
                        var = var.substr(0, brpos);
                        util::rtrim(var);
                        if (def_fn) str_to_parse = str_to_parse.substr(pos + 1);
                    }
                } else if (util::is_varname(var)) {
                    // Assignment
                    str_to_parse = str_to_parse.substr(pos + 1);
                }
            }
        }

        for (size_t i = 0; i < def_fn_args.size(); ++i) {
            // Pre-register variables
            env.addr_of(def_fn_args[i], false);
        }
        std::string parse_err;
        Expr expr = parse(will_use_latex ?  latex_to_nivalis(str_to_parse)
                : str_to_parse, env, !(do_diff || do_optim), // expicit
                true, // quiet
                def_fn_args.size(), // max args
                &parse_err);
        if (parse_err.size()) {
            os << parse_err;
            return false;
        }
        if (do_optim) {
            expr.optimize();
            expr.repr(os, env) << "\n";
        } else if (do_diff) {
            Expr diff = expr.diff(diff_var_addr, env);
            diff.repr(os, env) << "\n";
        } else {
            double output;
            if (def_fn || !std::isnan(output = expr(env))) {
                // Assignment statement
                if (var.size() && parse_err.empty()) {
                    if (def_fn) {
                        // Define function
                        std::vector<uint64_t> bindings;
                        for (size_t i = 0; i < def_fn_args.size(); ++i) {
                            bindings.push_back(
                                    def_fn_args[i][0] == '$' ? -1 :
                                    env.addr_of(def_fn_args[i]));
                        }
                        auto addr = env.def_func(var, expr, bindings);
                        if (~addr) {
                            os << var << "(";
                            for (size_t i = 0; i < def_fn_args.size(); ++i) {
                                if (i) os << ", ";
                                os << "$" << i;
                            }
                            os << ") = ";
                            env.funcs[addr].expr.repr(os, env) << std::endl;
                        }

                    } else {
                        // Define variable
                        double var_val;
                        if (assn_opcode != OpCode::bsel) {
                            // Operator assignment
                            auto addr = env.addr_of(var, true);
                            if (addr == -1) {
                                os << "Undefined variable \"" << var
                                    << "\" (operator assignment)\n";
                                return false;
                            }
                            var_val = Expr::constant(env.vars[addr])
                                .combine(assn_opcode,
                                        Expr::constant(output))(env);
                        } else {
                            // Usual assignment
                            var_val = output;
                        }
                        env.set(var, var_val);
                        os << var << " = " << var_val << std::endl;
                    }
                } else {
                    os << output << std::endl;
                }
            }
        }
    }
    return true;
}